

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_cmpi_16_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  uVar3 = OPER_AW_16();
  uVar2 = uVar3 - uVar1;
  m68ki_cpu.n_flag = uVar2 >> 8;
  m68ki_cpu.not_z_flag = uVar2 & 0xffff;
  m68ki_cpu.v_flag = ((uVar2 ^ uVar3) & (uVar1 ^ uVar3)) >> 8;
  m68ki_cpu.c_flag = uVar2 >> 8;
  return;
}

Assistant:

static void m68k_op_cmpi_16_aw(void)
{
	uint src = OPER_I_16();
	uint dst = OPER_AW_16();
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);
	FLAG_C = CFLAG_16(res);
}